

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

Result * __thiscall
doctest::detail::Expression_lhs::operator_cast_to_Result
          (Result *__return_storage_ptr__,Expression_lhs *this)

{
  byte bVar1;
  ContextOptions *pCVar2;
  String local_60;
  String local_38;
  byte local_19;
  Expression_lhs *pEStack_18;
  bool res;
  Expression_lhs<bool> *this_local;
  
  local_19 = (byte)*this & 1;
  if ((*(uint *)(this + 4) & 0x100) != 0) {
    local_19 = (local_19 ^ 0xff) & 1;
  }
  pEStack_18 = this;
  this_local = (Expression_lhs<bool> *)__return_storage_ptr__;
  if ((local_19 != 0) &&
     (pCVar2 = getContextOptions(), bVar1 = local_19, (pCVar2->success & 1U) == 0)) {
    String::String(&local_60);
    Result::Result(__return_storage_ptr__,(bool)(bVar1 & 1),&local_60);
    String::~String(&local_60);
    return __return_storage_ptr__;
  }
  bVar1 = local_19;
  doctest::toString(&local_38,(bool)((byte)*this & 1));
  Result::Result(__return_storage_ptr__,(bool)(bVar1 & 1),&local_38);
  String::~String(&local_38);
  return __return_storage_ptr__;
}

Assistant:

DOCTEST_NOINLINE operator Result() {
// this is needed only foc MSVC 2015:
// https://ci.appveyor.com/project/onqtam/doctest/builds/38181202
DOCTEST_MSVC_SUPPRESS_WARNING_WITH_PUSH(4800) // 'int': forcing value to bool
            bool res = static_cast<bool>(lhs);
DOCTEST_MSVC_SUPPRESS_WARNING_POP
            if(m_at & assertType::is_false) //!OCLINT bitwise operator in conditional
                res = !res;

            if(!res || getContextOptions()->success)
                return Result(res, toString(lhs));
            return Result(res);
        }